

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp
# Opt level: O0

IterateResult __thiscall
glcts::MultisampleTextureTexStorage2DUnsupportedSamplesCountForColorTexturesTest::iterate
          (MultisampleTextureTexStorage2DUnsupportedSamplesCountForColorTexturesTest *this)

{
  undefined1 uVar1;
  GLenum GVar2;
  int iVar3;
  deUint32 dVar4;
  deBool dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  TestError *pTVar7;
  int local_60;
  GLboolean fixedsamplelocations;
  int fixedsamplelocations_index;
  GLenum internalformat;
  int internalformat_index;
  GLsizei width;
  GLenum target;
  int internalformat_list_count;
  GLenum internalformat_list [5];
  int local_2c;
  GLint gl_max_samples_value;
  GLint gl_max_internalformat_samples_value;
  GLint gl_max_color_texture_samples_value;
  int fixedsamplelocations_list_count;
  GLboolean fixedsamplelocations_list [2];
  long lStack_18;
  GLsizei height;
  Functions *gl;
  MultisampleTextureTexStorage2DUnsupportedSamplesCountForColorTexturesTest *this_local;
  
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar6->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar3);
  fixedsamplelocations_list_count = 1;
  gl_max_color_texture_samples_value._2_2_ = 0x100;
  gl_max_internalformat_samples_value = 2;
  gl_max_samples_value = -1;
  local_2c = -1;
  internalformat_list[4] = 0xffffffff;
  _target = 0x8d6200008229;
  internalformat_list[0] = 0x906f;
  internalformat_list[1] = 0x8c43;
  internalformat_list[2] = 0x8231;
  fixedsamplelocations_index = 0;
  do {
    if (4 < fixedsamplelocations_index) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return STOP;
    }
    GVar2 = (&target)[fixedsamplelocations_index];
    for (local_60 = 0; local_60 < 2; local_60 = local_60 + 1) {
      uVar1 = *(undefined1 *)((long)&gl_max_color_texture_samples_value + (long)local_60 + 2);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])();
      (**(code **)(lStack_18 + 0x868))(0x8d57,internalformat_list + 4);
      dVar4 = (**(code **)(lStack_18 + 0x800))();
      glu::checkError(dVar4,"Failed to retrieve GL_MAX_SAMPLES value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                      ,0x32e);
      (**(code **)(lStack_18 + 0x868))(0x910e,&gl_max_samples_value);
      dVar4 = (**(code **)(lStack_18 + 0x800))();
      glu::checkError(dVar4,"Failed to retrieve GL_MAX_COLOR_TEXTURE_SAMPLES value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                      ,0x333);
      (**(code **)(lStack_18 + 0x880))(0x9100,GVar2,0x80a9,1,&local_2c);
      dVar4 = (**(code **)(lStack_18 + 0x800))();
      glu::checkError(dVar4,"glGetInternalformativ() failed to retrieve GL_SAMPLES",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                      ,0x338);
      (**(code **)(lStack_18 + 0x1390))(0x9100,local_2c + 1,GVar2,1,1,uVar1);
      do {
        dVar5 = ::deGetFalse();
        if (dVar5 != 0) {
LAB_013f284a:
          pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar7,
                     "glTexStorage2DMultisample() did not generate GL_INVALID_OPERATION error.",
                     "gl.getError() == GL_INVALID_OPERATION",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                     ,0x340);
          __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        iVar3 = (**(code **)(lStack_18 + 0x800))();
        if (iVar3 != 0x502) goto LAB_013f284a;
        dVar5 = ::deGetFalse();
      } while (dVar5 != 0);
      (**(code **)(lStack_18 + 0x1390))(0x9102,local_2c + 1,GVar2,1,1,uVar1);
      do {
        dVar5 = ::deGetFalse();
        if (dVar5 != 0) {
LAB_013f2905:
          pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar7,"glTexStorage2DMultisample() did not generate GL_INVALID_ENUM error.",
                     "gl.getError() == GL_INVALID_ENUM",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                     ,0x34c);
          __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        iVar3 = (**(code **)(lStack_18 + 0x800))();
        if (iVar3 != 0x500) goto LAB_013f2905;
        dVar5 = ::deGetFalse();
      } while (dVar5 != 0);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
    }
    fixedsamplelocations_index = fixedsamplelocations_index + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult MultisampleTextureTexStorage2DUnsupportedSamplesCountForColorTexturesTest::iterate()
{
	/* Test case variables */
	const glw::Functions& gl						  = m_context.getRenderContext().getFunctions();
	const glw::GLsizei	height					  = 1;
	const glw::GLboolean  fixedsamplelocations_list[] = { GL_FALSE, GL_TRUE };
	const int			  fixedsamplelocations_list_count =
		sizeof(fixedsamplelocations_list) / sizeof(fixedsamplelocations_list[0]);
	glw::GLint		   gl_max_color_texture_samples_value  = -1; /* Will be determined later */
	glw::GLint		   gl_max_internalformat_samples_value = -1; /* Will be determined later */
	glw::GLint		   gl_max_samples_value				   = -1; /* Will be determined later */
	const glw::GLenum  internalformat_list[]	 = { GL_R8, GL_RGB565, GL_RGB10_A2UI, GL_SRGB8_ALPHA8, GL_R8I };
	const int		   internalformat_list_count = sizeof(internalformat_list) / sizeof(internalformat_list[0]);
	const glw::GLenum  target = GL_TEXTURE_2D_MULTISAMPLE; /* Test case uses GL_TEXTURE_2D_MULTISAMPLE target */
	const glw::GLsizei width  = 1;

	/* Iterate through all internal formats test case should check */
	for (int internalformat_index = 0; internalformat_index < internalformat_list_count; internalformat_index++)
	{
		/* Iteration-specific internalformat */
		glw::GLenum internalformat = internalformat_list[internalformat_index];

		/* Iterate through all fixedsamplelocations test case should check */
		for (int fixedsamplelocations_index = 0; fixedsamplelocations_index < fixedsamplelocations_list_count;
			 fixedsamplelocations_index++)
		{
			/* Iteration-specific fixedsamplelocations */
			glw::GLboolean fixedsamplelocations = fixedsamplelocations_list[fixedsamplelocations_index];

			/* Initialize texture object and bind it to GL_TEXTURE_2D_MULTISAMPLE target */
			initInternalIteration();

			/* Get GL_MAX_SAMPLES value */
			gl.getIntegerv(GL_MAX_SAMPLES, &gl_max_samples_value);

			GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to retrieve GL_MAX_SAMPLES value");

			/* Get GL_MAX_COLOR_TEXTURE_SAMPLES value */
			gl.getIntegerv(GL_MAX_COLOR_TEXTURE_SAMPLES, &gl_max_color_texture_samples_value);

			GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to retrieve GL_MAX_COLOR_TEXTURE_SAMPLES value");

			/* Retrieve maximum amount of samples available for the texture target considered */
			gl.getInternalformativ(target, internalformat, GL_SAMPLES, 1, &gl_max_internalformat_samples_value);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetInternalformativ() failed to retrieve GL_SAMPLES");

			/* Issue call with valid parameters, but samples argument might be invalid */
			gl.texStorage2DMultisample(target, gl_max_internalformat_samples_value + 1, internalformat, width, height,
									   fixedsamplelocations);

			/* Expect GL_INVALID_OPERATION error code. */
			TCU_CHECK_MSG(gl.getError() == GL_INVALID_OPERATION,
						  "glTexStorage2DMultisample() did not generate GL_INVALID_OPERATION error.");

			/* Issue call with valid parameters, but to another target GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES and with invalid samples.
			 *
			 * NOTE: This can be executed on both the implementations that support GL_OES_texture_storage_multisample_2d_array extension
			 *       and on those that don't.
			 */
			gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, gl_max_internalformat_samples_value + 1,
									   internalformat, width, height, fixedsamplelocations);

			/* Expect GL_INVALID_ENUM error code from invalid target. */
			TCU_CHECK_MSG(gl.getError() == GL_INVALID_ENUM,
						  "glTexStorage2DMultisample() did not generate GL_INVALID_ENUM error.");

			/* Deinitialize texture object and unbind texture object bound to GL_TEXTURE_2D_MULTISAMPLE target */
			deinitInternalIteration();
		}
	}

	/* Test case passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}